

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O0

DdGen * Cudd_FirstCube(DdManager *dd,DdNode *f,int **cube,double *value)

{
  int iVar1;
  uint *puVar2;
  DdNode *pDVar3;
  uint *puVar4;
  int local_6c;
  int nvars;
  int i;
  DdNode *preg;
  DdNode *prev;
  DdNode *nreg;
  DdNode *next;
  DdNode *treg;
  DdNode *top;
  DdGen *gen;
  double *value_local;
  int **cube_local;
  DdNode *f_local;
  DdManager *dd_local;
  
  if ((dd == (DdManager *)0x0) || (f == (DdNode *)0x0)) {
    dd_local = (DdManager *)0x0;
  }
  else {
    dd_local = (DdManager *)malloc(0x38);
    if (dd_local == (DdManager *)0x0) {
      dd->errorCode = CUDD_MEMORY_OUT;
      dd_local = (DdManager *)0x0;
    }
    else {
      *(DdManager **)&dd_local->sentinel = dd;
      *(undefined4 *)&(dd_local->sentinel).next = 0;
      *(undefined4 *)((long)&(dd_local->sentinel).next + 4) = 0;
      (dd_local->sentinel).type.value = 0.0;
      (dd_local->sentinel).type.kids.E = (DdNode *)0x0;
      *(undefined4 *)&(dd_local->sentinel).Id = 0;
      dd_local->one = (DdNode *)0x0;
      dd_local->zero = (DdNode *)0x0;
      iVar1 = dd->size;
      pDVar3 = (DdNode *)malloc((long)iVar1 << 2);
      (dd_local->sentinel).type.kids.T = pDVar3;
      if ((dd_local->sentinel).type.kids.T == (DdNode *)0x0) {
        dd->errorCode = CUDD_MEMORY_OUT;
        if (dd_local != (DdManager *)0x0) {
          free(dd_local);
        }
        dd_local = (DdManager *)0x0;
      }
      else {
        for (local_6c = 0; local_6c < iVar1; local_6c = local_6c + 1) {
          (&((dd_local->sentinel).type.kids.T)->index)[local_6c] = 2;
        }
        pDVar3 = (DdNode *)malloc((long)(iVar1 + 1) << 3);
        dd_local->one = pDVar3;
        if (dd_local->one == (DdNode *)0x0) {
          dd->errorCode = CUDD_MEMORY_OUT;
          if ((dd_local->sentinel).type.kids.T != (DdNode *)0x0) {
            free((dd_local->sentinel).type.kids.T);
            (dd_local->sentinel).type.value = 0.0;
          }
          if (dd_local != (DdManager *)0x0) {
            free(dd_local);
          }
          dd_local = (DdManager *)0x0;
        }
        else {
          for (local_6c = 0; local_6c <= iVar1; local_6c = local_6c + 1) {
            *(undefined8 *)(&dd_local->one->index + (long)local_6c * 2) = 0;
          }
          *(DdNode **)(&dd_local->one->index + (long)(int)(dd_local->sentinel).Id * 2) = f;
          *(int *)&(dd_local->sentinel).Id = (int)(dd_local->sentinel).Id + 1;
          while( true ) {
            while( true ) {
              treg = *(DdNode **)
                      (&dd_local->one->index + (long)((int)(dd_local->sentinel).Id + -1) * 2);
              pDVar3 = (DdNode *)((ulong)treg & 0xfffffffffffffffe);
              if (pDVar3->index == 0x7fffffff) break;
              (&((dd_local->sentinel).type.kids.T)->index)[pDVar3->index] = 0;
              nreg = (pDVar3->type).kids.E;
              if (treg != pDVar3) {
                nreg = (DdNode *)((ulong)nreg ^ 1);
              }
              *(DdNode **)(&dd_local->one->index + (long)(int)(dd_local->sentinel).Id * 2) = nreg;
              *(int *)&(dd_local->sentinel).Id = (int)(dd_local->sentinel).Id + 1;
            }
            if ((treg != (DdNode *)((ulong)dd->one ^ 1)) && (treg != dd->background)) break;
            while( true ) {
              if ((int)(dd_local->sentinel).Id == 1) {
                *(undefined4 *)((long)&(dd_local->sentinel).next + 4) = 0;
                *(int *)&(dd_local->sentinel).Id = (int)(dd_local->sentinel).Id + -1;
                goto LAB_00a37c2e;
              }
              puVar2 = *(uint **)(&dd_local->one->index +
                                 (long)((int)(dd_local->sentinel).Id + -2) * 2);
              puVar4 = (uint *)((ulong)puVar2 & 0xfffffffffffffffe);
              nreg = *(DdNode **)(puVar4 + 4);
              if (puVar2 != puVar4) {
                nreg = (DdNode *)((ulong)nreg ^ 1);
              }
              if (nreg != treg) break;
              (&((dd_local->sentinel).type.kids.T)->index)[*puVar4] = 2;
              *(int *)&(dd_local->sentinel).Id = (int)(dd_local->sentinel).Id + -1;
              treg = *(DdNode **)
                      (&dd_local->one->index + (long)((int)(dd_local->sentinel).Id + -1) * 2);
            }
            (&((dd_local->sentinel).type.kids.T)->index)[*puVar4] = 1;
            *(DdNode **)(&dd_local->one->index + (long)((int)(dd_local->sentinel).Id + -1) * 2) =
                 nreg;
          }
          *(undefined4 *)((long)&(dd_local->sentinel).next + 4) = 1;
          (dd_local->sentinel).type.kids.E = (DdNode *)(treg->type).value;
LAB_00a37c2e:
          *cube = (int *)(dd_local->sentinel).type.value;
          *value = (double)(dd_local->sentinel).type.kids.E;
        }
      }
    }
  }
  return (DdGen *)dd_local;
}

Assistant:

DdGen *
Cudd_FirstCube(
  DdManager * dd,
  DdNode * f,
  int ** cube,
  CUDD_VALUE_TYPE * value)
{
    DdGen *gen;
    DdNode *top, *treg, *next, *nreg, *prev, *preg;
    int i;
    int nvars;

    /* Sanity Check. */
    if (dd == NULL || f == NULL) return(NULL);

    /* Allocate generator an initialize it. */
    gen = ABC_ALLOC(DdGen,1);
    if (gen == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        return(NULL);
    }

    gen->manager = dd;
    gen->type = CUDD_GEN_CUBES;
    gen->status = CUDD_GEN_EMPTY;
    gen->gen.cubes.cube = NULL;
    gen->gen.cubes.value = DD_ZERO_VAL;
    gen->stack.sp = 0;
    gen->stack.stack = NULL;
    gen->node = NULL;

    nvars = dd->size;
    gen->gen.cubes.cube = ABC_ALLOC(int,nvars);
    if (gen->gen.cubes.cube == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        ABC_FREE(gen);
        return(NULL);
    }
    for (i = 0; i < nvars; i++) gen->gen.cubes.cube[i] = 2;

    /* The maximum stack depth is one plus the number of variables.
    ** because a path may have nodes at all levels, including the
    ** constant level.
    */
    gen->stack.stack = ABC_ALLOC(DdNodePtr, nvars+1);
    if (gen->stack.stack == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        ABC_FREE(gen->gen.cubes.cube);
        ABC_FREE(gen);
        return(NULL);
    }
    for (i = 0; i <= nvars; i++) gen->stack.stack[i] = NULL;

    /* Find the first cube of the onset. */
    gen->stack.stack[gen->stack.sp] = f; gen->stack.sp++;

    while (1) {
        top = gen->stack.stack[gen->stack.sp-1];
        treg = Cudd_Regular(top);
        if (!cuddIsConstant(treg)) {
            /* Take the else branch first. */
            gen->gen.cubes.cube[treg->index] = 0;
            next = cuddE(treg);
            if (top != treg) next = Cudd_Not(next);
            gen->stack.stack[gen->stack.sp] = next; gen->stack.sp++;
        } else if (top == Cudd_Not(DD_ONE(dd)) || top == dd->background) {
            /* Backtrack */
            while (1) {
                if (gen->stack.sp == 1) {
                    /* The current node has no predecessor. */
                    gen->status = CUDD_GEN_EMPTY;
                    gen->stack.sp--;
                    goto done;
                }
                prev = gen->stack.stack[gen->stack.sp-2];
                preg = Cudd_Regular(prev);
                nreg = cuddT(preg);
                if (prev != preg) {next = Cudd_Not(nreg);} else {next = nreg;}
                if (next != top) { /* follow the then branch next */
                    gen->gen.cubes.cube[preg->index] = 1;
                    gen->stack.stack[gen->stack.sp-1] = next;
                    break;
                }
                /* Pop the stack and try again. */
                gen->gen.cubes.cube[preg->index] = 2;
                gen->stack.sp--;
                top = gen->stack.stack[gen->stack.sp-1];
                treg = Cudd_Regular(top);
            }
        } else {
            gen->status = CUDD_GEN_NONEMPTY;
            gen->gen.cubes.value = cuddV(top);
            goto done;
        }
    }

done:
    *cube = gen->gen.cubes.cube;
    *value = gen->gen.cubes.value;
    return(gen);

}